

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O1

int matchNonSingletonOutputs
              (Abc_Ntk_t *pNtk1,Vec_Ptr_t **nodesInLevel1,Vec_Int_t **iMatch1,Vec_Int_t **iDep1,
              Vec_Int_t *matchedInputs1,int *iGroup1,Vec_Int_t **oMatch1,int *oGroup1,
              Abc_Ntk_t *pNtk2,Vec_Ptr_t **nodesInLevel2,Vec_Int_t **iMatch2,Vec_Int_t **iDep2,
              Vec_Int_t *matchedInputs2,int *iGroup2,Vec_Int_t **oMatch2,int *oGroup2,
              Vec_Int_t *matchedOutputs1,Vec_Int_t *matchedOutputs2,Vec_Int_t *oMatchedGroups,
              Vec_Int_t *iNonSingleton,Abc_Ntk_t *subNtk1,Abc_Ntk_t *subNtk2,Vec_Ptr_t *oMatchPairs,
              Vec_Int_t *oNonSingleton,int oI,int idx,int ii,int iidx)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  Vec_Int_t *mismatch;
  int *piVar8;
  void *__s;
  void **ppvVar9;
  void *pvVar10;
  long lVar11;
  int *__ptr;
  int *__ptr_00;
  ulong uVar12;
  Vec_Int_t *pVVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  int oI_00;
  int iVar18;
  
  matchNonSingletonOutputs_MATCH_FOUND = 0;
  if (oNonSingleton->nSize == oI) {
    if ((iNonSingleton == (Vec_Int_t *)0x0) ||
       (iVar6 = match1by1(pNtk1,nodesInLevel1,iMatch1,iDep1,matchedInputs1,iGroup1,oMatch1,oGroup1,
                          pNtk2,nodesInLevel2,iMatch2,iDep2,matchedInputs2,iGroup2,oMatch2,oGroup2,
                          matchedOutputs1,matchedOutputs2,oMatchedGroups,iNonSingleton,ii,iidx),
       iVar6 != 0)) {
      matchNonSingletonOutputs_MATCH_FOUND = 1;
    }
    goto LAB_0029c878;
  }
  if ((oI < 0) || (oNonSingleton->nSize <= oI)) goto LAB_0029cde9;
  iVar6 = oNonSingleton->pArray[(uint)oI];
  mismatch = (Vec_Int_t *)malloc(0x10);
  mismatch->nCap = 0x10;
  mismatch->nSize = 0;
  piVar8 = (int *)malloc(0x40);
  mismatch->pArray = piVar8;
  pVVar13 = oMatch1[iVar6];
  iVar7 = pVVar13->nSize;
  sVar14 = (long)iVar7 * 4;
  __s = malloc(sVar14);
  if (0 < (long)iVar7) {
    memset(__s,0,sVar14);
  }
  if ((idx < 0) || (iVar7 <= idx)) goto LAB_0029cde9;
  uVar12 = (ulong)(uint)idx;
  iVar7 = pVVar13->pArray[uVar12];
  if (((long)iVar7 < 0) || (subNtk1->vPos->nSize <= iVar7)) {
LAB_0029ce08:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar10 = subNtk1->vPos->pArray[iVar7];
  uVar1 = oMatchPairs->nCap;
  if (oMatchPairs->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (oMatchPairs->pArray == (void **)0x0) {
        ppvVar9 = (void **)malloc(0x80);
      }
      else {
        ppvVar9 = (void **)realloc(oMatchPairs->pArray,0x80);
      }
      oMatchPairs->pArray = ppvVar9;
      iVar7 = 0x10;
    }
    else {
      iVar7 = uVar1 * 2;
      if (iVar7 <= (int)uVar1) goto LAB_0029c7ac;
      if (oMatchPairs->pArray == (void **)0x0) {
        ppvVar9 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar9 = (void **)realloc(oMatchPairs->pArray,(ulong)uVar1 << 4);
      }
      oMatchPairs->pArray = ppvVar9;
    }
    oMatchPairs->nCap = iVar7;
  }
LAB_0029c7ac:
  iVar7 = oMatchPairs->nSize;
  oMatchPairs->nSize = iVar7 + 1;
  oMatchPairs->pArray[iVar7] = pvVar10;
  if (oMatch1[iVar6]->nSize <= idx) {
LAB_0029cde9:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  Vec_IntPush(matchedOutputs1,oMatch1[iVar6]->pArray[uVar12]);
  pVVar13 = oMatch2[iVar6];
  if (0 < pVVar13->nSize && (matchNonSingletonOutputs_MATCH_FOUND & 1) == 0) {
    lVar17 = 0;
    do {
      uVar1 = pVVar13->pArray[lVar17];
      if (((ulong)uVar1 != 0xffffffff) && (*(int *)((long)__s + lVar17 * 4) != 1)) {
        if (((int)uVar1 < 0) || (subNtk2->vPos->nSize <= (int)uVar1)) goto LAB_0029ce08;
        pvVar10 = subNtk2->vPos->pArray[uVar1];
        uVar1 = oMatchPairs->nCap;
        if (oMatchPairs->nSize == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (oMatchPairs->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc(0x80);
            }
            else {
              ppvVar9 = (void **)realloc(oMatchPairs->pArray,0x80);
            }
            iVar7 = 0x10;
          }
          else {
            iVar7 = uVar1 * 2;
            if (iVar7 <= (int)uVar1) goto LAB_0029c964;
            if (oMatchPairs->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar9 = (void **)realloc(oMatchPairs->pArray,(ulong)uVar1 << 4);
            }
          }
          oMatchPairs->pArray = ppvVar9;
          oMatchPairs->nCap = iVar7;
        }
LAB_0029c964:
        iVar7 = oMatchPairs->nSize;
        oMatchPairs->nSize = iVar7 + 1;
        oMatchPairs->pArray[iVar7] = pvVar10;
        if (oMatch2[iVar6]->nSize <= lVar17) goto LAB_0029cde9;
        Vec_IntPush(matchedOutputs2,oMatch2[iVar6]->pArray[lVar17]);
        matchNonSingletonOutputs::counter = matchNonSingletonOutputs::counter + 1;
        iVar7 = Abc_NtkBmSat(subNtk1,subNtk2,(Vec_Ptr_t *)0x0,oMatchPairs,mismatch,0);
        if (iVar7 == 0) {
          pVVar3 = subNtk1->vPis;
          sVar14 = (size_t)pVVar3->nSize;
          pvVar10 = malloc(sVar14 + 1);
          *(undefined1 *)((long)pvVar10 + sVar14) = 0;
          if (0 < (long)sVar14) {
            memset(pvVar10,0x30,sVar14);
          }
          iVar7 = mismatch->nSize;
          if (0 < (long)iVar7) {
            uVar15 = 1;
            do {
              if ((ulong)(long)iVar7 <= uVar15) goto LAB_0029cde9;
              *(char *)((long)pvVar10 + (long)mismatch->pArray[uVar15 - 1]) =
                   (char)mismatch->pArray[uVar15];
              iVar18 = (int)uVar15;
              uVar15 = uVar15 + 2;
            } while (iVar18 + 1 < iVar7);
          }
          piVar8 = (int *)malloc((long)subNtk1->vCis->nSize << 2);
          if (0 < pVVar3->nSize) {
            lVar11 = 0;
            do {
              piVar8[lVar11] = *(char *)((long)pvVar10 + lVar11) + -0x30;
              lVar11 = lVar11 + 1;
            } while (lVar11 < pVVar3->nSize);
          }
          pVVar4 = subNtk1->vBoxes;
          if (0 < pVVar4->nSize) {
            ppvVar9 = pVVar4->pArray;
            lVar11 = 0;
            do {
              if ((*(uint *)((long)ppvVar9[lVar11] + 0x14) & 0xf) == 8) {
                piVar8[pVVar3->nSize + lVar11] = *(int *)((long)ppvVar9[lVar11] + 0x38) + -1;
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < pVVar4->nSize);
          }
          __ptr = Abc_NtkVerifySimulatePattern(subNtk1,piVar8);
          pVVar3 = subNtk2->vBoxes;
          if (0 < pVVar3->nSize) {
            ppvVar9 = pVVar3->pArray;
            lVar11 = 0;
            do {
              if ((*(uint *)((long)ppvVar9[lVar11] + 0x14) & 0xf) == 8) {
                piVar8[subNtk2->vPis->nSize + lVar11] = *(int *)((long)ppvVar9[lVar11] + 0x38) + -1;
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < pVVar3->nSize);
          }
          __ptr_00 = Abc_NtkVerifySimulatePattern(subNtk2,piVar8);
          uVar1 = oMatch1[iVar6]->nSize;
          if (0 < (int)uVar1) {
            if ((int)uVar1 <= idx) goto LAB_0029cde9;
            iVar7 = __ptr[oMatch1[iVar6]->pArray[uVar12]];
            pVVar13 = oMatch2[iVar6];
            uVar2 = pVVar13->nSize;
            uVar15 = (ulong)uVar2;
            if ((int)uVar2 < 1) {
              uVar15 = 0;
            }
            uVar16 = 0;
            do {
              if (uVar15 == uVar16) goto LAB_0029cde9;
              if (iVar7 != __ptr_00[pVVar13->pArray[uVar16]]) {
                *(undefined4 *)((long)__s + uVar16 * 4) = 1;
              }
              uVar16 = uVar16 + 1;
            } while (uVar1 != uVar16);
          }
          if (pvVar10 != (void *)0x0) {
            free(pvVar10);
          }
          if (piVar8 != (int *)0x0) {
            free(piVar8);
          }
          if (__ptr != (int *)0x0) {
            free(__ptr);
          }
          if (__ptr_00 != (int *)0x0) {
            free(__ptr_00);
          }
        }
        else {
          if (oMatch2[iVar6]->nSize <= lVar17) goto LAB_0029cde9;
          piVar8 = oMatch2[iVar6]->pArray;
          iVar7 = piVar8[lVar17];
          piVar8[lVar17] = -1;
          iVar18 = idx + 1;
          oI_00 = oI;
          if (oMatch1[iVar6]->nSize + -1 == idx) {
            iVar18 = 0;
            oI_00 = oI + 1;
          }
          matchNonSingletonOutputs
                    (pNtk1,nodesInLevel1,iMatch1,iDep1,matchedInputs1,iGroup1,oMatch1,oGroup1,pNtk2,
                     nodesInLevel2,iMatch2,iDep2,matchedInputs2,iGroup2,oMatch2,oGroup2,
                     matchedOutputs1,matchedOutputs2,oMatchedGroups,iNonSingleton,subNtk1,subNtk2,
                     oMatchPairs,oNonSingleton,oI_00,iVar18,ii,iidx);
          if (oMatch2[iVar6]->nSize <= lVar17) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          oMatch2[iVar6]->pArray[lVar17] = iVar7;
        }
        if (matchNonSingletonOutputs_MATCH_FOUND == 0) {
          if (oMatchPairs->nSize < 1) goto LAB_0029ce46;
          oMatchPairs->nSize = oMatchPairs->nSize + -1;
          if (matchedOutputs2->nSize < 1) goto LAB_0029ce65;
          matchedOutputs2->nSize = matchedOutputs2->nSize + -1;
        }
      }
      lVar17 = lVar17 + 1;
      pVVar13 = oMatch2[iVar6];
    } while ((lVar17 < pVVar13->nSize) && ((matchNonSingletonOutputs_MATCH_FOUND & 1) == 0));
  }
  bVar5 = matchNonSingletonOutputs_MATCH_FOUND;
  if ((matchNonSingletonOutputs_MATCH_FOUND & 1) == 0) {
    if (oMatchPairs->nSize < 1) {
LAB_0029ce46:
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x2e6,"void *Vec_PtrPop(Vec_Ptr_t *)");
    }
    oMatchPairs->nSize = oMatchPairs->nSize + -1;
    if (matchedOutputs1->nSize < 1) {
LAB_0029ce65:
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
    }
    matchedOutputs1->nSize = matchedOutputs1->nSize + -1;
  }
  if ((bVar5 & matchNonSingletonOutputs::counter != 0) == 1) {
    matchNonSingletonOutputs::counter = 0;
  }
  free(mismatch);
  if (__s != (void *)0x0) {
    free(__s);
  }
LAB_0029c878:
  return (uint)matchNonSingletonOutputs_MATCH_FOUND;
}

Assistant:

int matchNonSingletonOutputs(Abc_Ntk_t * pNtk1, Vec_Ptr_t ** nodesInLevel1, Vec_Int_t ** iMatch1, Vec_Int_t ** iDep1, Vec_Int_t * matchedInputs1, int * iGroup1, Vec_Int_t ** oMatch1, int * oGroup1,
                              Abc_Ntk_t * pNtk2, Vec_Ptr_t ** nodesInLevel2, Vec_Int_t ** iMatch2, Vec_Int_t ** iDep2, Vec_Int_t * matchedInputs2, int * iGroup2, Vec_Int_t ** oMatch2, int * oGroup2,
                              Vec_Int_t * matchedOutputs1, Vec_Int_t * matchedOutputs2, Vec_Int_t * oMatchedGroups, Vec_Int_t * iNonSingleton,                         
                              Abc_Ntk_t * subNtk1, Abc_Ntk_t * subNtk2, Vec_Ptr_t * oMatchPairs,
                              Vec_Int_t * oNonSingleton, int oI, int idx, int ii, int iidx)
{        
    static int MATCH_FOUND;
    int i;
    int j, temp;
    Vec_Int_t * mismatch;        
    int * skipList;    
    static int counter = 0;

    MATCH_FOUND = FALSE;
    
    if( oI == Vec_IntSize( oNonSingleton ) )
    {
        if( iNonSingleton != NULL)            
            if( match1by1(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                          pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                           matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton, ii, iidx) )
                MATCH_FOUND = TRUE;    

        if( iNonSingleton == NULL)
            MATCH_FOUND = TRUE;

        return MATCH_FOUND;
    }

    i = Vec_IntEntry(oNonSingleton, oI);

    mismatch = Vec_IntAlloc(10);
    
    skipList = ABC_ALLOC(int, Vec_IntSize(oMatch1[i]));

    for(j = 0; j < Vec_IntSize(oMatch1[i]); j++)
        skipList[j] = FALSE;

    Vec_PtrPush(oMatchPairs, Abc_NtkPo(subNtk1, Vec_IntEntry(oMatch1[i], idx)) );
    Vec_IntPush(matchedOutputs1, Vec_IntEntry(oMatch1[i], idx));

    for(j = 0; j < Vec_IntSize( oMatch2[i] ) && MATCH_FOUND == FALSE; j++)
    {
        if( Vec_IntEntry(oMatch2[i], j) == -1 || skipList[j] == TRUE)
            continue;

        Vec_PtrPush(oMatchPairs, Abc_NtkPo(subNtk2, Vec_IntEntry(oMatch2[i], j)));
        Vec_IntPush(matchedOutputs2, Vec_IntEntry(oMatch2[i], j));

        counter++;        
        if( Abc_NtkBmSat( subNtk1, subNtk2, NULL, oMatchPairs, mismatch, 0) )
        {
            /*fprintf(matchFile, "%s matched to %s\n", Abc_ObjName(Abc_NtkPo(pNtk1, Vec_IntEntry(oMatch1[i], idx))), 
                                         Abc_ObjName(Abc_NtkPo(pNtk2, Vec_IntEntry(oMatch2[i], j))));            */

            temp =  Vec_IntEntry(oMatch2[i], j);
            Vec_IntWriteEntry(oMatch2[i], j, -1);
            
            if(idx != Vec_IntSize( oMatch1[i] ) - 1)
                // call the same function with idx+1
                matchNonSingletonOutputs(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                                         pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                                         matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton,                         
                                         subNtk1, subNtk2, oMatchPairs,
                                         oNonSingleton, oI, idx+1, ii, iidx);
            else    
                // call the same function with idx = 0 and oI++
                matchNonSingletonOutputs(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                                         pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                                         matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton,                         
                                         subNtk1, subNtk2, oMatchPairs,
                                         oNonSingleton, oI+1, 0, ii, iidx);

            Vec_IntWriteEntry(oMatch2[i], j, temp);
        }        
        else
        {
            int * output1, * output2;
            int k;
            Abc_Obj_t * pObj;
            int * pModel;
            char * vPiValues;            
            

            vPiValues = ABC_ALLOC( char,  Abc_NtkPiNum(subNtk1) + 1);
            vPiValues[Abc_NtkPiNum(subNtk1)] = '\0';    
            
            for(k = 0; k < Abc_NtkPiNum(subNtk1); k++)
                vPiValues[k] = '0';

            for(k = 0; k < Vec_IntSize(mismatch); k += 2)            
                vPiValues[Vec_IntEntry(mismatch, k)] = Vec_IntEntry(mismatch, k+1);                        

            pModel = ABC_ALLOC( int, Abc_NtkCiNum(subNtk1) );    

            Abc_NtkForEachPi( subNtk1, pObj, k )
                pModel[k] = vPiValues[k] - '0';
            Abc_NtkForEachLatch( subNtk1, pObj, k )
                pModel[Abc_NtkPiNum(subNtk1)+k] = pObj->iData - 1;            
    
            output1 = Abc_NtkVerifySimulatePattern( subNtk1, pModel );

            Abc_NtkForEachLatch( subNtk2, pObj, k )
                pModel[Abc_NtkPiNum(subNtk2)+k] = pObj->iData - 1;

            output2 = Abc_NtkVerifySimulatePattern( subNtk2, pModel );
            

            for(k = 0; k < Vec_IntSize( oMatch1[i] ); k++)
                if(output1[Vec_IntEntry(oMatch1[i], idx)] != output2[Vec_IntEntry(oMatch2[i], k)])
                {
                    skipList[k] = TRUE;    
                    /*printf("Output is SKIPPED");*/
                }
                
            ABC_FREE( vPiValues );
            ABC_FREE( pModel );
            ABC_FREE( output1 );
            ABC_FREE( output2 );
        }
        
        if(MATCH_FOUND == FALSE )
        {
            Vec_PtrPop(oMatchPairs);
            Vec_IntPop(matchedOutputs2);
        }
    }

    if(MATCH_FOUND == FALSE )
    {
        Vec_PtrPop(oMatchPairs);
        Vec_IntPop(matchedOutputs1);
    }

    if(MATCH_FOUND && counter != 0)
    {        
        /*printf("Number of OUTPUT SAT instances = %d", counter);*/
        counter = 0;
    }

    ABC_FREE( mismatch );
    ABC_FREE( skipList );

    return MATCH_FOUND;
}